

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O3

int c_string_to_lisp_string(char *C,LispPTR Lisp)

{
  ushort uVar1;
  uint uVar2;
  DLword *pDVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = -1;
  if ((*(ushort *)((ulong)(Lisp >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 0xe) {
    sVar4 = strlen(C);
    if ((Lisp & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)Lisp);
    }
    pDVar3 = Lisp_world;
    if ((sVar4 + 1 <= (ulong)(long)*(int *)(Lisp_world + (ulong)Lisp + 6)) &&
       ((char)Lisp_world[(ulong)Lisp + 3] == 'C')) {
      if (sVar4 == 0xffffffffffffffff) {
        iVar6 = 0;
      }
      else {
        uVar2 = *(uint *)(Lisp_world + Lisp);
        uVar1 = Lisp_world[(ulong)Lisp + 2];
        iVar6 = 0;
        uVar5 = 0;
        do {
          *(char *)((long)pDVar3 + uVar5 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) =
               C[uVar5];
          uVar5 = uVar5 + 1;
        } while (sVar4 + 1 != uVar5);
      }
    }
  }
  return iVar6;
}

Assistant:

static int c_string_to_lisp_string(char *C, LispPTR Lisp) {
  OneDArray *arrayp;
  char *base;
  size_t length;

  length = strlen(C);
  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->totalsize < length + 1) { return (-1); }
  /* too short for C string */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strcpy(base, C);
#else
      {
        char *dp = C;
        for (size_t i = 0; i < length + 1; i++) {
          char ch = *dp++;
#ifdef DOS
          if (ch == '\\') dp++; /* skip 2nd \ in \\ in C strings */
#endif /* DOS */
          GETBYTE(base++) = ch;
        }
      }
#endif /* BYTESWAP */

      return 0;
    default: return -1;
  }
}